

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec3 __thiscall djb::beckmann::u2_to_h2_std_radial(beckmann *this,vec2 *u,float_t zi,float_t z_i)

{
  float fVar1;
  float_t fVar2;
  float_t fVar3;
  float fVar4;
  float fVar5;
  vec3 vVar6;
  vec3 local_10;
  
  fVar5 = 0.0;
  if (0.0 <= u->x) {
    fVar5 = u->x;
  }
  fVar1 = 1.0;
  if (fVar5 <= 1.0) {
    fVar1 = fVar5;
  }
  fVar5 = 0.0;
  if (0.0 <= u->y) {
    fVar5 = u->y;
  }
  fVar4 = 1.0;
  if (fVar5 <= 1.0) {
    fVar4 = fVar5;
  }
  fVar5 = fVar4 * 0.99998 + 1e-05;
  fVar2 = qf2(this,fVar1 * 0.99998 + 1e-05,zi,z_i);
  fVar3 = erfinv(fVar5 + fVar5 + -1.0);
  local_10._0_8_ = CONCAT44(fVar3,fVar2) ^ 0x8000000080000000;
  local_10.z = 1.0;
  vVar6 = normalize(&local_10);
  return vVar6;
}

Assistant:

vec3 beckmann::u2_to_h2_std_radial(const vec2 &u, float_t zi, float_t z_i) const
{
	// remap u2 to avoid singularities
	float_t u1 = sat(u.x) * (float_t)0.99998 + (float_t)0.00001;
	float_t u2 = sat(u.y) * (float_t)0.99998 + (float_t)0.00001;
	return r2_to_h2(vec2(qf2(u1, zi, z_i), qf3(u2)));
}